

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeViewPrivate::initialize(QTreeViewPrivate *this)

{
  long lVar1;
  QFlagsStorage<Qt::AlignmentFlag> type;
  int iVar2;
  Object *sender;
  Object *parent;
  QStyle *pQVar3;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  offset_in_QAbstractAnimation_to_subr unaff_retaddr;
  QHeaderView *header;
  QTreeView *q;
  QWidget *in_stack_ffffffffffffff68;
  code *other;
  QTreeViewPrivate *in_stack_ffffffffffffff70;
  Connection *this_00;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffff7c;
  QAbstractItemView *in_stack_ffffffffffffff80;
  Orientation orientation;
  QHeaderView *in_stack_ffffffffffffff90;
  QFramePrivate *in_stack_ffffffffffffffc8;
  Object *receiverPrivate;
  QTreeViewPrivate *this_01;
  QTreeView *in_stack_ffffffffffffffe0;
  Connection in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  sender = (Object *)q_func(in_RDI);
  updateIndentationFromStyle(in_stack_ffffffffffffff70);
  QFramePrivate::updateStyledFrameWidths(in_stack_ffffffffffffffc8);
  orientation = Horizontal;
  QAbstractItemView::setSelectionBehavior
            ((QAbstractItemView *)in_stack_ffffffffffffff70,
             (SelectionBehavior)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  QAbstractItemView::setSelectionMode
            ((QAbstractItemView *)in_stack_ffffffffffffff70,
             (SelectionMode)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  QAbstractItemView::setHorizontalScrollMode(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c.i);
  QWidget::setAttribute
            ((QWidget *)this_01,(WidgetAttribute)((ulong)sender >> 0x20),
             SUB81((ulong)sender >> 0x18,0));
  parent = (Object *)operator_new(0x28);
  QHeaderView::QHeaderView(in_stack_ffffffffffffff90,orientation,(QWidget *)parent);
  receiverPrivate = parent;
  QHeaderView::setSectionsMovable
            ((QHeaderView *)in_stack_ffffffffffffff70,
             SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
  QHeaderView::setStretchLastSection
            ((QHeaderView *)parent,SUB41(in_stack_ffffffffffffff7c.i >> 0x18,0));
  type.i = (Int)Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                              (enum_type)in_stack_ffffffffffffff70);
  QHeaderView::setDefaultAlignment
            ((QHeaderView *)in_stack_ffffffffffffff68,(Alignment)in_stack_ffffffffffffff7c.i);
  QTreeView::setHeader(in_stack_ffffffffffffffe0,(QHeaderView *)this_01);
  pQVar3 = QWidget::style(in_stack_ffffffffffffff68);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x71,0,sender);
  in_RDI->animationsEnabled = 0 < iVar2;
  other = endAnimatedOperation;
  this_00 = (Connection *)0x0;
  QObjectPrivate::connect<void(QAbstractAnimation::*)(),void(QTreeViewPrivate::*)()>
            (sender,unaff_retaddr,receiverPrivate,(Function)in_stack_fffffffffffffff0.d_ptr,type.i);
  QMetaObject::Connection::operator=(this_00,(Connection *)other);
  QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::initialize()
{
    Q_Q(QTreeView);

    updateIndentationFromStyle();
    updateStyledFrameWidths();
    q->setSelectionBehavior(QAbstractItemView::SelectRows);
    q->setSelectionMode(QAbstractItemView::SingleSelection);
    q->setHorizontalScrollMode(QAbstractItemView::ScrollPerPixel);
    q->setAttribute(Qt::WA_MacShowFocusRect);

    QHeaderView *header = new QHeaderView(Qt::Horizontal, q);
    header->setSectionsMovable(true);
    header->setStretchLastSection(true);
    header->setDefaultAlignment(Qt::AlignLeft|Qt::AlignVCenter);
    q->setHeader(header);
#if QT_CONFIG(animation)
    animationsEnabled = q->style()->styleHint(QStyle::SH_Widget_Animation_Duration, nullptr, q) > 0;
    animationConnection =
        QObjectPrivate::connect(&animatedOperation, &QVariantAnimation::finished,
                                this, &QTreeViewPrivate::endAnimatedOperation);
#endif // animation
}